

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::
emplace_back<slang::ast::ValueSymbol_const&>
          (SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *this,ValueSymbol *args)

{
  size_type sVar1;
  reference pos;
  pointer pLVar2;
  
  sVar1 = this->len;
  pos = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    pLVar2 = emplaceRealloc<slang::ast::ValueSymbol_const&>(this,pos,args);
    return pLVar2;
  }
  (pos->symbol).ptr = args;
  (pos->assigned).height = 0;
  (pos->assigned).rootSize = 0;
  this->len = sVar1 + 1;
  return pos;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }